

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

char * buffer_merge(Buffer **buffers,size_t n,size_t *_len)

{
  Buffer *pBVar1;
  BufferBlock *pBVar2;
  Buffer *pBVar3;
  char *pcVar4;
  size_t sVar5;
  char *__dest;
  BufferBlock *pBVar6;
  size_t sVar7;
  
  sVar7 = 0;
  pBVar3 = (Buffer *)0x0;
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    pBVar1 = buffers[sVar5];
    if (pBVar1 != (Buffer *)0x0) {
      if (pBVar3 == (Buffer *)0x0) {
        pBVar3 = pBVar1;
      }
      sVar7 = sVar7 + pBVar1->total_bytes;
    }
  }
  if ((pBVar3 == (Buffer *)0x0) ||
     (pcVar4 = (char *)(*pBVar3->m)((int)sVar7 + 1,pBVar3->d), pcVar4 == (char *)0x0)) {
    *_len = 0;
    return (char *)0x0;
  }
  *_len = sVar7;
  __dest = pcVar4;
  for (sVar5 = 0; sVar5 != n; sVar5 = sVar5 + 1) {
    pBVar3 = buffers[sVar5];
    if (pBVar3 != (Buffer *)0x0) {
      pBVar6 = pBVar3->head;
      while (pBVar6 != (BufferBlock *)0x0) {
        pBVar2 = pBVar6->next;
        memcpy(__dest,pBVar6->data,pBVar6->bytes);
        __dest = __dest + pBVar6->bytes;
        (*pBVar3->f)(pBVar6,pBVar3->d);
        pBVar6 = pBVar2;
      }
      pBVar3->total_bytes = 0;
      pBVar3->head = (BufferBlock *)0x0;
      pBVar3->tail = (BufferBlock *)0x0;
    }
  }
  *__dest = '\0';
  if (__dest == pcVar4 + sVar7) {
    return pcVar4;
  }
  __assert_fail("ptr == (retval + len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                ,0x399,"char *buffer_merge(Buffer **, const size_t, size_t *)");
}

Assistant:

char *buffer_merge(Buffer **buffers, const size_t n, size_t *_len)
{
    Buffer *first = NULL;
    size_t len = 0;
    size_t i;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        if (first == NULL)
            first = buffer;
        len += buffer->total_bytes;
    } // for

    char *retval = (char *) (first ? first->m(len + 1, first->d) : NULL);
    if (retval == NULL)
    {
        *_len = 0;
        return NULL;
    } // if

    *_len = len;
    char *ptr = retval;
    for (i = 0; i < n; i++)
    {
        Buffer *buffer = buffers[i];
        if (buffer == NULL)
            continue;
        BufferBlock *item = buffer->head;
        while (item != NULL)
        {
            BufferBlock *next = item->next;
            memcpy(ptr, item->data, item->bytes);
            ptr += item->bytes;
            buffer->f(item, buffer->d);
            item = next;
        } // while

        buffer->head = buffer->tail = NULL;
        buffer->total_bytes = 0;
    } // for
    *ptr = '\0';

    assert(ptr == (retval + len));

    return retval;
}